

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_getsha(MDD mdd,char *target)

{
  mddnode_t node;
  undefined1 local_80 [8];
  SHA256_CTX ctx;
  char *target_local;
  MDD mdd_local;
  
  ctx.buffer._56_8_ = target;
  SHA256_Init((SHA256_CTX *)local_80);
  lddmc_sha2_rec(mdd,(SHA256_CTX *)local_80);
  if (1 < mdd) {
    node = LDD_GETNODE(mdd);
    lddmc_unmark_rec(node);
  }
  SHA256_End((SHA256_CTX *)local_80,(char *)ctx.buffer._56_8_);
  return;
}

Assistant:

void
lddmc_getsha(MDD mdd, char *target)
{
    SHA256_CTX ctx;
    SHA256_Init(&ctx);
    lddmc_sha2_rec(mdd, &ctx);
    if (mdd > lddmc_true) lddmc_unmark_rec(LDD_GETNODE(mdd));
    SHA256_End(&ctx, target);
}